

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O3

QString * __thiscall
Mustache::Renderer::render
          (QString *__return_storage_ptr__,Renderer *this,QString *_template,Context *context)

{
  QArrayData *pQVar1;
  
  if ((this->m_error).d.ptr != (char16_t *)0x0) {
    pQVar1 = &((this->m_error).d.d)->super_QArrayData;
    (this->m_error).d.d = (Data *)0x0;
    (this->m_error).d.ptr = (char16_t *)0x0;
    (this->m_error).d.size = 0;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
  }
  this->m_errorPos = -1;
  if ((this->m_errorPartial).d.ptr != (char16_t *)0x0) {
    pQVar1 = &((this->m_errorPartial).d.d)->super_QArrayData;
    (this->m_errorPartial).d.d = (Data *)0x0;
    (this->m_errorPartial).d.ptr = (char16_t *)0x0;
    (this->m_errorPartial).d.size = 0;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
  }
  QString::operator=(&this->m_tagStartMarker,(QString *)&this->m_defaultTagStartMarker);
  QString::operator=(&this->m_tagEndMarker,(QString *)&this->m_defaultTagEndMarker);
  render(__return_storage_ptr__,this,_template,0,(int)(_template->d).size,context);
  return __return_storage_ptr__;
}

Assistant:

QString Renderer::render(const QString& _template, Context* context)
{
	m_error.clear();
	m_errorPos = -1;
	m_errorPartial.clear();

	m_tagStartMarker = m_defaultTagStartMarker;
	m_tagEndMarker = m_defaultTagEndMarker;

	return render(_template, 0, _template.length(), context);
}